

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O3

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *loop;
  long *plVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  size_t sVar9;
  long *plVar10;
  void **ppvVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  undefined8 *puVar16;
  long *plVar17;
  void **ppvVar18;
  
  iVar5 = -0x16;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    iVar5 = loop->inotify_fd;
    if (iVar5 == -1) {
      iVar5 = uv__inotify_init1(0x80800);
      if (iVar5 == -1) {
        piVar8 = __errno_location();
        if (*piVar8 == 0x26) {
          iVar6 = uv__inotify_init();
          if (iVar6 == -1) {
            iVar5 = -*piVar8;
          }
          else {
            iVar7 = uv__cloexec_ioctl(iVar6,1);
            if ((iVar7 != 0) || (iVar7 = uv__nonblock_ioctl(iVar6,1), iVar5 = iVar6, iVar7 != 0)) {
              iVar5 = iVar7;
              uv__close(iVar6);
            }
          }
        }
        else {
          iVar5 = -*piVar8;
        }
      }
      if (iVar5 < 0) {
        return iVar5;
      }
      loop->inotify_fd = iVar5;
      uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar5);
      uv__io_start(loop,&loop->inotify_read_watcher,1);
      iVar5 = handle->loop->inotify_fd;
    }
    iVar5 = uv__inotify_add_watch(iVar5,path,0xfc6);
    if (iVar5 == -1) {
      piVar8 = __errno_location();
      iVar5 = -*piVar8;
    }
    else {
      for (plVar10 = (long *)handle->loop->inotify_watchers; plVar10 != (long *)0x0;
          plVar10 = (long *)*plVar10) {
        if ((int)plVar10[8] <= iVar5) {
          if (iVar5 <= (int)plVar10[8]) goto LAB_001bf057;
          plVar10 = plVar10 + 1;
        }
      }
      sVar9 = strlen(path);
      plVar10 = (long *)uv__malloc(sVar9 + 0x49);
      if (plVar10 == (long *)0x0) {
        iVar5 = -0xc;
      }
      else {
        *(int *)(plVar10 + 8) = iVar5;
        memcpy(plVar10 + 9,path,sVar9 + 1);
        plVar10[7] = (long)(plVar10 + 9);
        plVar10[4] = (long)(plVar10 + 4);
        plVar10[5] = (long)(plVar10 + 4);
        *(undefined4 *)(plVar10 + 6) = 0;
        plVar12 = (long *)handle->loop->inotify_watchers;
        ppvVar11 = &handle->loop->inotify_watchers;
        if (plVar12 == (long *)0x0) {
          *plVar10 = 0;
          plVar10[1] = 0;
          plVar10[2] = 0;
          *(undefined4 *)(plVar10 + 3) = 1;
          *ppvVar11 = plVar10;
          plVar12 = plVar10;
        }
        else {
          do {
            plVar13 = plVar12;
            iVar6 = (int)plVar13[8];
            plVar15 = plVar13;
            if (iVar6 <= iVar5) {
              if (iVar5 <= iVar6) goto LAB_001bf057;
              plVar15 = plVar13 + 1;
            }
            plVar12 = (long *)*plVar15;
          } while ((long *)*plVar15 != (long *)0x0);
          plVar10[2] = (long)plVar13;
          *plVar10 = 0;
          plVar10[1] = 0;
          *(undefined4 *)(plVar10 + 3) = 1;
          plVar13[iVar6 <= iVar5] = (long)plVar10;
          plVar12 = plVar10;
          do {
            if ((int)plVar13[3] != 1) break;
            plVar15 = (long *)plVar13[2];
            plVar17 = (long *)*plVar15;
            plVar14 = plVar12;
            if (plVar13 == plVar17) {
              lVar4 = plVar15[1];
              if ((lVar4 != 0) && (*(int *)(lVar4 + 0x18) == 1)) {
                *(undefined4 *)(lVar4 + 0x18) = 0;
                goto LAB_001beeb8;
              }
              plVar3 = (long *)plVar13[1];
              if (plVar3 == plVar12) {
                lVar4 = *plVar3;
                plVar13[1] = lVar4;
                if (lVar4 == 0) {
                  plVar3[2] = (long)plVar15;
                  puVar16 = (undefined8 *)plVar13[2];
LAB_001befa2:
                  ppvVar18 = (void **)(puVar16 + (plVar13 != (long *)*puVar16));
                }
                else {
                  *(long **)(lVar4 + 0x10) = plVar13;
                  puVar16 = (undefined8 *)plVar13[2];
                  plVar3[2] = (long)puVar16;
                  ppvVar18 = ppvVar11;
                  if (puVar16 != (undefined8 *)0x0) goto LAB_001befa2;
                }
                *ppvVar18 = plVar3;
                *plVar3 = (long)plVar13;
                plVar13[2] = (long)plVar3;
                plVar17 = (long *)*plVar15;
                plVar14 = plVar13;
                plVar13 = plVar12;
              }
              *(undefined4 *)(plVar13 + 3) = 0;
              *(undefined4 *)(plVar15 + 3) = 1;
              lVar4 = plVar17[1];
              *plVar15 = lVar4;
              if (lVar4 != 0) {
                *(long **)(lVar4 + 0x10) = plVar15;
              }
              puVar16 = (undefined8 *)plVar15[2];
              plVar17[2] = (long)puVar16;
              ppvVar18 = ppvVar11;
              if (puVar16 != (undefined8 *)0x0) {
                ppvVar18 = (void **)(puVar16 + (plVar15 != (long *)*puVar16));
              }
              *ppvVar18 = plVar17;
              plVar17[1] = (long)plVar15;
              plVar15[2] = (long)plVar17;
            }
            else if ((plVar17 == (long *)0x0) || ((int)plVar17[3] != 1)) {
              plVar17 = (long *)*plVar13;
              if (plVar17 == plVar12) {
                lVar4 = plVar17[1];
                *plVar13 = lVar4;
                if (lVar4 == 0) {
                  plVar17[2] = (long)plVar15;
                  puVar16 = (undefined8 *)plVar13[2];
LAB_001bef31:
                  ppvVar18 = (void **)(puVar16 + (plVar13 != (long *)*puVar16));
                }
                else {
                  *(long **)(lVar4 + 0x10) = plVar13;
                  puVar16 = (undefined8 *)plVar13[2];
                  plVar17[2] = (long)puVar16;
                  ppvVar18 = ppvVar11;
                  if (puVar16 != (undefined8 *)0x0) goto LAB_001bef31;
                }
                *ppvVar18 = plVar17;
                plVar17[1] = (long)plVar13;
                plVar13[2] = (long)plVar17;
                plVar14 = plVar13;
                plVar13 = plVar12;
              }
              *(undefined4 *)(plVar13 + 3) = 0;
              *(undefined4 *)(plVar15 + 3) = 1;
              plVar12 = (long *)plVar15[1];
              lVar4 = *plVar12;
              plVar15[1] = lVar4;
              if (lVar4 != 0) {
                *(long **)(lVar4 + 0x10) = plVar15;
              }
              puVar16 = (undefined8 *)plVar15[2];
              plVar12[2] = (long)puVar16;
              ppvVar18 = ppvVar11;
              if (puVar16 != (undefined8 *)0x0) {
                ppvVar18 = (void **)(puVar16 + (plVar15 != (long *)*puVar16));
              }
              *ppvVar18 = plVar12;
              *plVar12 = (long)plVar15;
              plVar15[2] = (long)plVar12;
            }
            else {
              *(undefined4 *)(plVar17 + 3) = 0;
LAB_001beeb8:
              *(undefined4 *)(plVar13 + 3) = 0;
              *(undefined4 *)(plVar15 + 3) = 1;
              plVar14 = plVar15;
            }
            plVar13 = (long *)plVar14[2];
            plVar12 = plVar14;
          } while (plVar13 != (long *)0x0);
          plVar12 = (long *)*ppvVar11;
        }
        *(undefined4 *)(plVar12 + 3) = 0;
LAB_001bf057:
        uVar2 = handle->flags;
        if (((uVar2 & 4) == 0) && (handle->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        handle->watchers[0] = plVar10 + 4;
        plVar12 = (long *)plVar10[5];
        handle->watchers[1] = plVar12;
        *plVar12 = (long)handle->watchers;
        plVar10[5] = (long)handle->watchers;
        handle->path = (char *)plVar10[7];
        handle->cb = cb;
        handle->wd = iVar5;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = UV__IN_ATTRIB
         | UV__IN_CREATE
         | UV__IN_MODIFY
         | UV__IN_DELETE
         | UV__IN_DELETE_SELF
         | UV__IN_MOVE_SELF
         | UV__IN_MOVED_FROM
         | UV__IN_MOVED_TO;

  wd = uv__inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}